

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# native_object.cpp
# Opt level: O1

native_object_property * __thiscall mjs::native_object::find(native_object *this,char *name)

{
  gc_heap_ptr_untracked<mjs::gc_vector<mjs::native_object::native_object_property>::gc_table,_true>
  *this_00;
  int iVar1;
  gc_vector<mjs::native_object::native_object_property> *pgVar2;
  gc_table *pgVar3;
  gc_table *pgVar4;
  gc_table *pgVar5;
  long lVar6;
  native_object_property *p;
  native_object_property *__s1;
  
  pgVar2 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::native_object::native_object_property>,_true>::
           dereference(&this->native_properties_,(this->super_object).heap_);
  this_00 = &pgVar2->table_;
  pgVar3 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::native_object::native_object_property>::gc_table,_true>
           ::dereference(this_00,pgVar2->heap_);
  pgVar4 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::native_object::native_object_property>::gc_table,_true>
           ::dereference(this_00,pgVar2->heap_);
  pgVar5 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::native_object::native_object_property>::gc_table,_true>
           ::dereference(this_00,pgVar2->heap_);
  lVar6 = (ulong)pgVar5->length_ * 0x38;
  if (pgVar3 != (gc_table *)((long)pgVar4 + lVar6)) {
    __s1 = (native_object_property *)(pgVar3 + 1);
    do {
      iVar1 = strcmp(__s1->name,name);
      if (iVar1 == 0) {
        return __s1;
      }
      __s1 = __s1 + 1;
    } while (__s1 != (native_object_property *)((long)pgVar4 + lVar6 + 0x10));
  }
  return (native_object_property *)0x0;
}

Assistant:

native_object::native_object_property* native_object::find(const char* name) const {
    for (auto& p: native_properties_.dereference(heap())) {
        if (!strcmp(p.name, name)) {
            return &p;
        }
    }
    return nullptr;
}